

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * __thiscall
spvtools::opt::analysis::Type::GetDecorationStr_abi_cxx11_
          (string *__return_storage_ptr__,Type *this)

{
  pointer pvVar1;
  pointer pvVar2;
  char *pcVar3;
  ulong uVar4;
  ostringstream oss;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[[",2);
  pvVar2 = (this->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 != pvVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
      if ((pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar4 = 0;
        do {
          pcVar3 = ", ";
          if (uVar4 == 0) {
            pcVar3 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pcVar3,(ulong)((uint)(uVar4 != 0) * 2));
          if ((ulong)((long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar4) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar4);
          }
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          uVar4 = uVar4 + 1;
        } while (uVar4 < (ulong)((long)(pvVar2->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar2->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != pvVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]]",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Type::GetDecorationStr() const {
  std::ostringstream oss;
  oss << "[[";
  for (const auto& decoration : decorations_) {
    oss << "(";
    for (size_t i = 0; i < decoration.size(); ++i) {
      oss << (i > 0 ? ", " : "");
      oss << decoration.at(i);
    }
    oss << ")";
  }
  oss << "]]";
  return oss.str();
}